

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

void __thiscall clask::server_t::static_dir(server_t *this,string *path,string *dir,bool listing)

{
  pointer pcVar1;
  undefined1 local_d8 [32];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  bool local_98;
  _Any_data local_90;
  code *local_80;
  _Any_data local_70;
  code *local_60;
  undefined8 uStack_58;
  _Any_data local_50;
  code *local_40;
  undefined8 uStack_38;
  
  pcVar1 = (path->_M_dataplus)._M_p;
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,pcVar1,pcVar1 + path->_M_string_length);
  pcVar1 = (dir->_M_dataplus)._M_p;
  local_b8._M_p = (pointer)&local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + dir->_M_string_length);
  local_98 = listing;
  std::function<void(clask::response_writer&,clask::request&)>::
  function<clask::server_t::static_dir(std::__cxx11::string_const&,std::__cxx11::string_const&,bool)::_lambda(clask::response_writer&,clask::request&)_1_,void>
            ((function<void(clask::response_writer&,clask::request&)> *)local_90._M_pod_data,
             (anon_class_72_3_b8803698 *)local_d8);
  local_40 = (code *)0x0;
  uStack_38 = 0;
  local_50._M_unused._M_object = (void *)0x0;
  local_50._8_8_ = 0;
  local_60 = (code *)0x0;
  uStack_58 = 0;
  local_70._M_unused._M_object = (void *)0x0;
  local_70._8_8_ = 0;
  parse_tree(this,&this->treeGET,path,(func_t *)&local_90);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  return;
}

Assistant:

inline void server_t::static_dir(const std::string& path, const std::string& dir, bool listing) {
  parse_tree(treeGET, path, func_t {
    .f_writer = [path, dir, listing](response_writer& resp, request& req) {
      std::vector<std::string> paths;
      std::string p = req.uri;
      while (true) {
        auto pos = p.find('/', 1);
        if (pos == std::string::npos) {
          auto sub = p.substr(1);
          if (sub == "..") paths.pop_back();
          else paths.emplace_back(sub);
          break;
        } else {
          auto sub = p.substr(1, pos - 1);
          if (sub == "..") paths.pop_back();
          else paths.emplace_back(sub);
        }
        p = p.substr(pos);
      }
      std::ostringstream os;
      for (auto it = paths.begin(); it != paths.end(); ++it) {
        if (it != paths.end()) os << "/";
        os << *it;
      }
      auto req_path = os.str();
      auto res = std::mismatch(req_path.begin(), req_path.end(), path.begin());
      if (res.first == path.end()) {
        resp.code = 404;
        resp.set_header("content-type", "text/plain");
        resp.write("Not Found");
        return;
      }
      req_path = url_decode(req_path.substr(path.size()));
      req_path = dir + "/" + req_path;
      if (req_path[req_path.size() - 1] == '/') {
        if (listing) {
          serve_dir(resp, req, req_path);
          return;
        }
        req_path += "index.html";
      }

      serve_file(resp, req, req_path);
    }
  });
}